

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_integral.cpp
# Opt level: O0

void duckdb::IntegralDecompressFunction<unsigned_int,int>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  anon_class_8_1_c2c95694 fun;
  int *piVar1;
  reference count;
  Vector *in_RDX;
  DataChunk *in_RDI;
  int min_val;
  size_type in_stack_ffffffffffffffc8;
  vector<duckdb::Vector,_true> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  
  vector<duckdb::Vector,_true>::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  piVar1 = ConstantVector::GetData<int>((Vector *)0x11d970a);
  iVar2 = *piVar1;
  count = vector<duckdb::Vector,_true>::operator[]
                    (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  DataChunk::size(in_RDI);
  fun.min_val._4_4_ = iVar2;
  fun.min_val._0_4_ = in_stack_ffffffffffffffe0;
  UnaryExecutor::
  Execute<unsigned_int,int,duckdb::IntegralDecompressFunction<unsigned_int,int>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(unsigned_int_const&)_1_>
            ((Vector *)&stack0xffffffffffffffe4,in_RDX,(idx_t)count,fun,CANNOT_ERROR);
  return;
}

Assistant:

static void IntegralDecompressFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	D_ASSERT(args.data[1].GetVectorType() == VectorType::CONSTANT_VECTOR);
	D_ASSERT(args.data[1].GetType() == result.GetType());
	const auto min_val = ConstantVector::GetData<RESULT_TYPE>(args.data[1])[0];
	UnaryExecutor::Execute<INPUT_TYPE, RESULT_TYPE>(
	    args.data[0], result, args.size(),
	    [&](const INPUT_TYPE &input) {
		    return TemplatedIntegralDecompress<INPUT_TYPE, RESULT_TYPE>::Operation(input, min_val);
	    },
	    FunctionErrors::CANNOT_ERROR);
}